

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::compute_median
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                 *maps)

{
  value_type vVar1;
  size_t sVar2;
  size_type sVar3;
  reference pvVar4;
  size_type sVar5;
  const_reference ppPVar6;
  reference pvVar7;
  iterator __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_80;
  size_type local_78;
  size_t map_no;
  size_t j;
  size_t i;
  allocator<double> local_49;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> to_compute_median;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  heat_maps;
  vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
  *maps_local;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this_local;
  
  check_and_initialize_maps
            ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,this,maps);
  sVar3 = std::
          vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
          ::size(maps);
  std::allocator<double>::allocator(&local_49);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_48,sVar3,&local_49);
  std::allocator<double>::~allocator(&local_49);
  j = 0;
  while( true ) {
    sVar2 = j;
    sVar3 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)&to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    if (sVar2 == sVar3) break;
    map_no = 0;
    while( true ) {
      sVar2 = map_no;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&to_compute_median.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,j);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
      if (sVar2 == sVar3) break;
      local_78 = 0;
      while( true ) {
        sVar3 = local_78;
        sVar5 = std::
                vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                ::size(maps);
        if (sVar3 == sVar5) break;
        ppPVar6 = std::
                  vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                  ::operator[](maps,local_78);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&(*ppPVar6)->heat_map,j);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,map_no);
        vVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_48,local_78);
        *pvVar7 = vVar1;
        local_78 = local_78 + 1;
      }
      local_80._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_48);
      local_90._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_48);
      sVar3 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_48);
      local_88 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator+(&local_90,sVar3 >> 1);
      __last = std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)local_48);
      std::
      nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (local_80,local_88,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __last._M_current);
      sVar3 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_48);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_48,sVar3 >> 1);
      vVar1 = *pvVar7;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&to_compute_median.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,j);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,map_no);
      *pvVar7 = vVar1;
      map_no = map_no + 1;
    }
    j = j + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->heat_map,
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  ppPVar6 = std::
            vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
            ::operator[](maps,0);
  this->min_ = (*ppPVar6)->min_;
  ppPVar6 = std::
            vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
            ::operator[](maps,0);
  this->max_ = (*ppPVar6)->max_;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::compute_median(const std::vector<Persistence_heat_maps*>& maps) {
  std::vector<std::vector<double> > heat_maps = this->check_and_initialize_maps(maps);

  std::vector<double> to_compute_median(maps.size());
  for (size_t i = 0; i != heat_maps.size(); ++i) {
    for (size_t j = 0; j != heat_maps[i].size(); ++j) {
      for (size_t map_no = 0; map_no != maps.size(); ++map_no) {
        to_compute_median[map_no] = maps[map_no]->heat_map[i][j];
      }
      std::nth_element(to_compute_median.begin(), to_compute_median.begin() + to_compute_median.size() / 2,
                       to_compute_median.end());
      heat_maps[i][j] = to_compute_median[to_compute_median.size() / 2];
    }
  }
  this->heat_map = heat_maps;
  this->min_ = maps[0]->min_;
  this->max_ = maps[0]->max_;
}